

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void statfs_cb(uv_fs_t *req)

{
  long *plVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (req->fs_type == UV_FS_STATFS) {
    if (req->result == 0) {
      plVar1 = (long *)req->ptr;
      if (plVar1 == (long *)0x0) {
        pcVar3 = "req->ptr != NULL";
        uVar2 = 0x15d;
      }
      else if (*plVar1 == 0) {
        pcVar3 = "stats->f_type > 0";
        uVar2 = 0x164;
      }
      else if (plVar1[1] == 0) {
        pcVar3 = "stats->f_bsize > 0";
        uVar2 = 0x167;
      }
      else if (plVar1[2] == 0) {
        pcVar3 = "stats->f_blocks > 0";
        uVar2 = 0x168;
      }
      else if ((ulong)plVar1[2] < (ulong)plVar1[3]) {
        pcVar3 = "stats->f_bfree <= stats->f_blocks";
        uVar2 = 0x169;
      }
      else if ((ulong)plVar1[3] < (ulong)plVar1[4]) {
        pcVar3 = "stats->f_bavail <= stats->f_bfree";
        uVar2 = 0x16a;
      }
      else if ((ulong)plVar1[5] < (ulong)plVar1[6]) {
        pcVar3 = "stats->f_ffree <= stats->f_files";
        uVar2 = 0x171;
      }
      else {
        uv_fs_req_cleanup(req);
        if (req->ptr == (void *)0x0) {
          statfs_cb_count = statfs_cb_count + 1;
          return;
        }
        pcVar3 = "req->ptr == NULL";
        uVar2 = 0x174;
      }
    }
    else {
      pcVar3 = "req->result == 0";
      uVar2 = 0x15c;
    }
  }
  else {
    pcVar3 = "req->fs_type == UV_FS_STATFS";
    uVar2 = 0x15b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void statfs_cb(uv_fs_t* req) {
  uv_statfs_t* stats;

  ASSERT(req->fs_type == UV_FS_STATFS);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);
  stats = req->ptr;

#if defined(_WIN32) || defined(__sun) || defined(_AIX) || defined(__MVS__) || \
  defined(__OpenBSD__) || defined(__NetBSD__)
  ASSERT(stats->f_type == 0);
#else
  ASSERT(stats->f_type > 0);
#endif

  ASSERT(stats->f_bsize > 0);
  ASSERT(stats->f_blocks > 0);
  ASSERT(stats->f_bfree <= stats->f_blocks);
  ASSERT(stats->f_bavail <= stats->f_bfree);

#ifdef _WIN32
  ASSERT(stats->f_files == 0);
  ASSERT(stats->f_ffree == 0);
#else
  /* There is no assertion for stats->f_files that makes sense, so ignore it. */
  ASSERT(stats->f_ffree <= stats->f_files);
#endif
  uv_fs_req_cleanup(req);
  ASSERT(req->ptr == NULL);
  statfs_cb_count++;
}